

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_m16sub64_q(DisasContext_conflict14 *ctx,TCGv_i32 rl,TCGv_i32 rh,TCGv_i32 arg1_low,
                   TCGv_i32 arg1_high,TCGv_i32 arg2,TCGv_i32 arg3,uint32_t n)

{
  TCGContext_conflict9 *s;
  TCGTemp *a1;
  TCGTemp *pTVar1;
  TCGTemp *ts;
  TCGTemp *ts_00;
  uintptr_t o;
  uintptr_t o_1;
  TCGv_i64 ret;
  uintptr_t o_4;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I32,false);
  ret_00 = (TCGv_i32)((long)a1 - (long)s);
  pTVar1 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I32,false);
  ret_01 = (TCGv_i32)((long)pTVar1 - (long)s);
  pTVar1 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I64,false);
  ts = tcg_temp_new_internal_tricore(s,TCG_TYPE_I64,false);
  ts_00 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I64,false);
  if (n == 0) {
    tcg_gen_op3_tricore(s,INDEX_op_mul_i32,(TCGArg)a1,(TCGArg)(arg2 + (long)s),
                        (TCGArg)(arg3 + (long)s));
  }
  else {
    tcg_gen_op3_tricore(s,INDEX_op_mul_i32,(TCGArg)a1,(TCGArg)(arg2 + (long)s),
                        (TCGArg)(arg3 + (long)s));
    tcg_gen_shli_i32_tricore(s,ret_00,ret_00,1);
    tcg_gen_setcondi_i32_tricore(s,TCG_COND_EQ,ret_01,ret_00,-0x80000000);
    tcg_gen_sub_i32(s,ret_00,ret_00,ret_01);
  }
  ret = (TCGv_i64)((long)ts - (long)s);
  tcg_gen_ext_i32_i64_tricore(s,ret,ret_00);
  tcg_gen_shli_i64_tricore(s,ret,ret,0x10);
  tcg_gen_concat_i32_i64_tricore(s,(TCGv_i64)((long)pTVar1 - (long)s),arg1_low,arg1_high);
  gen_sub64_d(ctx,(TCGv_i64)((long)ts_00 - (long)s),(TCGv_i64)((long)pTVar1 - (long)s),ret);
  tcg_gen_extr_i64_i32_tricore(s,rl,rh,(TCGv_i64)((long)ts_00 - (long)s));
  tcg_temp_free_internal_tricore(s,pTVar1);
  tcg_temp_free_internal_tricore(s,ts);
  tcg_temp_free_internal_tricore(s,ts_00);
  tcg_temp_free_internal_tricore(s,(TCGTemp *)(ret_00 + (long)s));
  tcg_temp_free_internal_tricore(s,(TCGTemp *)(ret_01 + (long)s));
  return;
}

Assistant:

static inline void
gen_m16sub64_q(DisasContext *ctx, TCGv rl, TCGv rh, TCGv arg1_low, TCGv arg1_high, TCGv arg2,
               TCGv arg3, uint32_t n)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv temp = tcg_temp_new(tcg_ctx);
    TCGv temp2 = tcg_temp_new(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

    if (n == 0) {
        tcg_gen_mul_tl(tcg_ctx, temp, arg2, arg3);
    } else { /* n is expected to be 1 */
        tcg_gen_mul_tl(tcg_ctx, temp, arg2, arg3);
        tcg_gen_shli_tl(tcg_ctx, temp, temp, 1);
        /* catch special case r1 = r2 = 0x8000 */
        tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, temp2, temp, 0x80000000);
        tcg_gen_sub_tl(tcg_ctx, temp, temp, temp2);
    }
    tcg_gen_ext_i32_i64(tcg_ctx, t2, temp);
    tcg_gen_shli_i64(tcg_ctx, t2, t2, 16);
    tcg_gen_concat_i32_i64(tcg_ctx, t1, arg1_low, arg1_high);
    gen_sub64_d(ctx, t3, t1, t2);
    /* write back result */
    tcg_gen_extr_i64_i32(tcg_ctx, rl, rh, t3);

    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, t2);
    tcg_temp_free_i64(tcg_ctx, t3);
    tcg_temp_free(tcg_ctx, temp);
    tcg_temp_free(tcg_ctx, temp2);
}